

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O3

TPZFMatrix<long_double> * __thiscall
TPZFMatrix<long_double>::operator-=(TPZFMatrix<long_double> *this,longdouble val)

{
  long lVar1;
  longdouble *plVar2;
  longdouble *plVar3;
  
  lVar1 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol *
          (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  if (0 < lVar1) {
    plVar3 = this->fElem;
    plVar2 = plVar3 + lVar1;
    do {
      *plVar3 = *plVar3 - val;
      plVar3 = plVar3 + 1;
    } while (plVar3 < plVar2);
  }
  return this;
}

Assistant:

TPZFMatrix<TVar> &operator-=(const TVar val )  { return operator+=( -val ); }